

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void print_string(flatcc_json_printer_t *ctx,char *s,size_t n)

{
  byte c;
  char *pcVar1;
  ulong n_00;
  
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '\"';
  while( true ) {
    for (n_00 = 0; ((c = s[n_00], 0x1f < c && (c != 0x22)) && (c != 0x5c)); n_00 = n_00 + 1) {
    }
    print(ctx,s,n_00);
    if (n == n_00) break;
    print_escape(ctx,c);
    s = s + n_00 + 1;
    n = n + ~n_00;
  }
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '\"';
  return;
}

Assistant:

static void print_string(flatcc_json_printer_t *ctx, const char *s, size_t n)
{
    const char *p = s;
    /* Unsigned is important. */
    unsigned char c;
    size_t k;

    print_char('\"');
    for (;;) {
        c = (unsigned char)*p;
        while (c >= 0x20 && c != '\"' && c != '\\') {
            c = (unsigned char)*++p;
        }
        k = (size_t)(p - s);
        /* Even if k == 0, print ensures buffer flush. */
        print(ctx, s, k);
        n -= k;
        if (n == 0) break;
        s += k;
        print_escape(ctx, c);
        ++p;
        --n;
        ++s;
    }
    print_char('\"');
}